

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O2

void Nwk_ObjMffcLabel_rec(Nwk_Obj_t *pNode,int fTopmost)

{
  int iVar1;
  long lVar2;
  
  if (((fTopmost != 0) || (((*(uint *)&pNode->field_0x20 & 7) != 1 && (pNode->nFanouts < 1)))) &&
     (iVar1 = pNode->pMan->nTravIds, pNode->TravId != iVar1)) {
    pNode->TravId = iVar1;
    for (lVar2 = 0; (lVar2 < pNode->nFanins && (pNode->pFanio[lVar2] != (Nwk_Obj_t *)0x0));
        lVar2 = lVar2 + 1) {
      Nwk_ObjMffcLabel_rec(pNode->pFanio[lVar2],0);
    }
  }
  return;
}

Assistant:

void Nwk_ObjMffcLabel_rec( Nwk_Obj_t * pNode, int fTopmost )
{
    Nwk_Obj_t * pFanin;
    int i;
    // add to the new support nodes
    if ( !fTopmost && (Nwk_ObjIsCi(pNode) || pNode->nFanouts > 0) )
        return;
    // skip visited nodes
    if ( Nwk_ObjIsTravIdCurrent(pNode) )
        return;
    Nwk_ObjSetTravIdCurrent(pNode);
    // recur on the children
    Nwk_ObjForEachFanin( pNode, pFanin, i )
        Nwk_ObjMffcLabel_rec( pFanin, 0 );
    // collect the internal node
//    printf( "%d ", pNode->Id );
}